

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFilterTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_TestFilter_invertMatching_TestShell::createTest(TEST_TestFilter_invertMatching_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFilterTest.cpp"
                                  ,0x3c);
  this_00->_vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_0037dc18;
  return this_00;
}

Assistant:

TEST(TestFilter, invertMatching)
{
    TestFilter filter("filter");
    filter.invertMatching();
    CHECK(!filter.match("filter"));
    CHECK(!filter.match("filterr"));
    CHECK(filter.match("notevenclose"));
    CHECK(filter.match(""));
}